

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O0

void __thiscall
Dinic_BenchmarkChainV1000E10000_Test::TestBody(Dinic_BenchmarkChainV1000E10000_Test *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char *message;
  AssertHelper local_d8;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  ll flow;
  int local_98;
  int local_94;
  int j;
  int i;
  Dinic d;
  int perEdge;
  int range;
  int m;
  int n;
  Dinic_BenchmarkChainV1000E10000_Test *this_local;
  
  srand(1);
  d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1000;
  d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 10;
  Dinic::Dinic((Dinic *)&j,1000);
  for (local_94 = 0; local_94 < 999; local_94 = local_94 + 1) {
    for (local_98 = 0;
        iVar1 = d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._4_4_,
        local_98 <
        (int)d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage; local_98 = local_98 + 1) {
      iVar3 = rand();
      Dinic::addEdge((Dinic *)&j,local_94,local_94 + 1,
                     (long)(iVar1 + iVar3 % d.pt.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
                    );
    }
  }
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Dinic::getFlow((Dinic *)&j,0,999);
  local_c4 = 0x3057;
  testing::internal::EqHelper<false>::Compare<int,long_long>
            ((EqHelper<false> *)local_c0,"12375","flow",&local_c4,(longlong *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/dinic_test.cpp"
               ,0x87,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  Dinic::~Dinic((Dinic *)&j);
  return;
}

Assistant:

TEST(Dinic, BenchmarkChainV1000E10000) {
    srand(1);
    int n = 1000;
    int m = 10000;
    int range = 1000;
    int perEdge = m / n; // yes, it's not exact
    Dinic d(n);
    rep(i, 0, n - 1) {
        rep(j, 0, perEdge) {
            d.addEdge(i, i + 1, range + rand() % range);
        }
    }
    ll flow = d.getFlow(0, n - 1);
    EXPECT_EQ(12375, flow);
}